

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O3

bool __thiscall jrtplib::RTPIPv6Address::IsSameAddress(RTPIPv6Address *this,RTPAddress *addr)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  
  if (((addr != (RTPAddress *)0x0) && (addr->addresstype == IPv6Address)) &&
     (this->port == *(uint16_t *)&addr[1].field_0xc)) {
    lVar1 = 0;
    do {
      bVar2 = (&(this->super_RTPAddress).field_0xc)[lVar1] == (&addr->field_0xc)[lVar1];
      if (!bVar2) {
        return bVar2;
      }
      bVar3 = lVar1 != 0xf;
      lVar1 = lVar1 + 1;
    } while (bVar3);
    return bVar2;
  }
  return false;
}

Assistant:

bool RTPIPv6Address::IsSameAddress(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != RTPAddress::IPv6Address)
		return false;

	const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
	const uint8_t *ip2 = addr2->ip.s6_addr;
	
	if (port != addr2->port)
		return false;
	
	for (int i = 0 ; i < 16 ; i++)
	{
		if (ip.s6_addr[i] != ip2[i])
			return false;
	}
	return true;
}